

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadePrimitives
          (VertexVaryingShader *this,GeometryEmitter *output,int verticesIn,PrimitivePacket *packets
          ,int numPackets,int invocationID)

{
  int iVar1;
  GenericVec4 *local_250;
  GenericVec4 *local_218;
  Vec4 local_208;
  Vector<float,_4> local_1f8;
  Vector<float,_4> local_1e8;
  Vector<float,_4> local_1d8;
  GenericVec4 local_1c8;
  Vector<float,_4> local_1b8;
  Vector<float,_4> local_1a8;
  Vector<float,_4> local_198;
  Vector<float,_4> local_188;
  tcu local_178 [16];
  anon_union_16_3_1194ccdc_for_v local_168;
  Vector<float,_4> local_158;
  undefined1 local_148 [8];
  GenericVec4 outputs_1 [2];
  float fStack_120;
  Vec4 inputColor_1;
  int verticeNdx;
  int ndx_1;
  Vec4 local_fc;
  Vector<float,_4> local_ec;
  Vec4 local_dc;
  Vector<float,_4> local_cc;
  Vec4 local_bc;
  int local_ac;
  int ndx;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  undefined1 local_78 [8];
  GenericVec4 outputs [2];
  Vec4 inputColor;
  Vec4 vertexOffset;
  int invocationID_local;
  int numPackets_local;
  PrimitivePacket *packets_local;
  int verticesIn_local;
  GeometryEmitter *output_local;
  VertexVaryingShader *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(inputColor.m_data + 2),-0.2,-0.2,0.0,0.0);
  if (*(int *)&(this->super_ShaderProgram).field_0x154 == -1) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffffb0,1.0,0.0,0.0,1.0);
    local_218 = (GenericVec4 *)local_78;
    do {
      rr::GenericVec4::GenericVec4(local_218);
      local_218 = local_218 + 1;
    } while (local_218 != (GenericVec4 *)((long)&outputs[1].v + 8));
    iVar1 = this->m_geometryOut;
    if (iVar1 != 0) {
      if (iVar1 == 1) {
        rr::GenericVec4::operator=
                  ((GenericVec4 *)local_78,(Vector<float,_4> *)&stack0xffffffffffffffb0);
      }
      else if (iVar1 == 2) {
        tcu::operator*((tcu *)&local_88,(Vector<float,_4> *)&stack0xffffffffffffffb0,0.5);
        rr::GenericVec4::operator=((GenericVec4 *)local_78,&local_88);
        tcu::Vector<float,_4>::swizzle
                  ((Vector<float,_4> *)&stack0xffffffffffffff58,(int)&stack0xffffffffffffffb0,1,0,2)
        ;
        tcu::operator*((tcu *)&local_98,(Vector<float,_4> *)&stack0xffffffffffffff58,0.5);
        rr::GenericVec4::operator=((GenericVec4 *)((long)&outputs[0].v + 8),&local_98);
      }
    }
    for (local_ac = 0; local_ac < numPackets; local_ac = local_ac + 1) {
      tcu::Vector<float,_4>::Vector(&local_cc,0.0,0.0,0.0,1.0);
      tcu::operator+((tcu *)&local_bc,&local_cc,(Vector<float,_4> *)(inputColor.m_data + 2));
      rr::GeometryEmitter::EmitVertex
                (output,&local_bc,1.0,(GenericVec4 *)local_78,packets[local_ac].primitiveIDIn);
      tcu::Vector<float,_4>::Vector(&local_ec,1.0,0.0,0.0,1.0);
      tcu::operator+((tcu *)&local_dc,&local_ec,(Vector<float,_4> *)(inputColor.m_data + 2));
      rr::GeometryEmitter::EmitVertex
                (output,&local_dc,1.0,(GenericVec4 *)local_78,packets[local_ac].primitiveIDIn);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&verticeNdx,1.0,1.0,0.0,1.0);
      tcu::operator+((tcu *)&local_fc,(Vector<float,_4> *)&verticeNdx,
                     (Vector<float,_4> *)(inputColor.m_data + 2));
      rr::GeometryEmitter::EmitVertex
                (output,&local_fc,1.0,(GenericVec4 *)local_78,packets[local_ac].primitiveIDIn);
      rr::GeometryEmitter::EndPrimitive(output);
    }
  }
  else {
    for (inputColor_1.m_data[3] = 0.0; (int)inputColor_1.m_data[3] < numPackets;
        inputColor_1.m_data[3] = (float)((int)inputColor_1.m_data[3] + 1)) {
      for (inputColor_1.m_data[2] = 0.0; (int)inputColor_1.m_data[2] < verticesIn;
          inputColor_1.m_data[2] = (float)((int)inputColor_1.m_data[2] + 1)) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)&outputs_1[1].v + 0xc));
        local_250 = (GenericVec4 *)local_148;
        do {
          rr::GenericVec4::GenericVec4(local_250);
          local_250 = local_250 + 1;
        } while (local_250 != (GenericVec4 *)((long)&outputs_1[1].v + 8));
        iVar1 = *(int *)&(this->super_ShaderProgram).field_0x154;
        if (iVar1 == 0) {
          tcu::Vector<float,_4>::Vector(&local_158,1.0,0.0,0.0,1.0);
          outputs_1[1].v._12_4_ = local_158.m_data[0];
          fStack_120 = local_158.m_data[1];
        }
        else if (iVar1 == 1) {
          rr::GenericVec4::get<float>((GenericVec4 *)&local_168);
          outputs_1[1].v._12_4_ = local_168.uData[0];
          fStack_120 = (float)local_168.uData[1];
        }
        else if (iVar1 == 2) {
          rr::GenericVec4::get<float>((GenericVec4 *)&local_198);
          tcu::operator*((tcu *)&local_188,&local_198,0.5);
          rr::GenericVec4::get<float>(&local_1c8);
          tcu::Vector<float,_4>::swizzle(&local_1b8,(int)&local_1c8,2,1,0);
          tcu::operator*((tcu *)&local_1a8,&local_1b8,0.5);
          tcu::operator+(local_178,&local_188,&local_1a8);
          stack0xfffffffffffffedc = local_178._0_8_;
        }
        iVar1 = this->m_geometryOut;
        if (iVar1 != 0) {
          if (iVar1 == 1) {
            rr::GenericVec4::operator=
                      ((GenericVec4 *)local_148,(Vector<float,_4> *)((long)&outputs_1[1].v + 0xc));
          }
          else if (iVar1 == 2) {
            tcu::operator*((tcu *)&local_1d8,(Vector<float,_4> *)((long)&outputs_1[1].v + 0xc),0.5);
            rr::GenericVec4::operator=((GenericVec4 *)local_148,&local_1d8);
            tcu::Vector<float,_4>::swizzle(&local_1f8,(int)outputs_1 + 0x1c,1,0,2);
            tcu::operator*((tcu *)&local_1e8,&local_1f8,0.5);
            rr::GenericVec4::operator=((GenericVec4 *)((long)&outputs_1[0].v + 8),&local_1e8);
          }
        }
        tcu::operator+((tcu *)&local_208,
                       &packets[(int)inputColor_1.m_data[3]].vertices[(int)inputColor_1.m_data[2]]->
                        position,(Vector<float,_4> *)(inputColor.m_data + 2));
        rr::GeometryEmitter::EmitVertex
                  (output,&local_208,
                   packets[(int)inputColor_1.m_data[3]].vertices[(int)inputColor_1.m_data[2]]->
                   pointSize,(GenericVec4 *)local_148,
                   packets[(int)inputColor_1.m_data[3]].primitiveIDIn);
      }
      rr::GeometryEmitter::EndPrimitive(output);
    }
  }
  return;
}

Assistant:

void VertexVaryingShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(invocationID);

	const tcu::Vec4 vertexOffset(-0.2f, -0.2f, 0, 0);

	if (m_vertexOut == -1)
	{
		// vertex is a no-op
		const tcu::Vec4 inputColor = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
		rr::GenericVec4	outputs[2];

		// output color
		switch (m_geometryOut)
		{
			case 0:
				break;

			case 1:
				outputs[0] = inputColor;
				break;

			case 2:
				outputs[0] = inputColor * 0.5f;
				outputs[1] = inputColor.swizzle(1, 0, 2, 3) * 0.5f;
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		for (int ndx = 0; ndx < numPackets; ++ndx)
		{
			output.EmitVertex(tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EmitVertex(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EmitVertex(tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f) + vertexOffset, 1.0f, outputs, packets[ndx].primitiveIDIn);
			output.EndPrimitive();
		}
	}
	else
	{
		// vertex is not a no-op
		for (int ndx = 0; ndx < numPackets; ++ndx)
		{
			for (int verticeNdx = 0; verticeNdx < verticesIn; ++verticeNdx)
			{
				tcu::Vec4		inputColor;
				rr::GenericVec4	outputs[2];

				// input color
				switch (m_vertexOut)
				{
					case 0:
						inputColor = tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
						break;

					case 1:
						inputColor = packets[ndx].vertices[verticeNdx]->outputs[0].get<float>();
						break;

					case 2:
						inputColor = (packets[ndx].vertices[verticeNdx]->outputs[0].get<float>() * 0.5f)
								   + (packets[ndx].vertices[verticeNdx]->outputs[1].get<float>().swizzle(2, 1, 0, 3) * 0.5f);
						break;

					default:
						DE_ASSERT(DE_FALSE);
				}

				// output color
				switch (m_geometryOut)
				{
					case 0:
						break;

					case 1:
						outputs[0] = inputColor;
						break;

					case 2:
						outputs[0] = inputColor * 0.5f;
						outputs[1] = inputColor.swizzle(1, 0, 2, 3) * 0.5f;
						break;

					default:
						DE_ASSERT(DE_FALSE);
				}

				output.EmitVertex(packets[ndx].vertices[verticeNdx]->position + vertexOffset, packets[ndx].vertices[verticeNdx]->pointSize, outputs, packets[ndx].primitiveIDIn);
			}
			output.EndPrimitive();
		}
	}
}